

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forkfd.c
# Opt level: O3

int forkfd_fork_fallback(int flags,pid_t *ppid)

{
  ffd_atomic_int *pfVar1;
  int iVar2;
  int iVar3;
  BigArray *pBVar4;
  int *piVar5;
  int *piVar6;
  ssize_t sVar7;
  long lVar8;
  int iVar9;
  SmallArray *__ptr;
  BigArray *pBVar10;
  long in_FS_OFFSET;
  bool bVar11;
  eventfd_t val64;
  int sync_pipe [2];
  int death_pipe [2];
  undefined1 *local_50;
  undefined8 local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  pthread_once(&forkfd_initialization,forkfd_initialize);
  LOCK();
  iVar2 = children.header.busyCount + 1;
  UNLOCK();
  bVar11 = 0xf < children.header.busyCount;
  children.header.busyCount = iVar2;
  if (bVar11) {
LAB_0043a3fe:
    pBVar10 = (BigArray *)&children;
    do {
      LOCK();
      pfVar1 = &(pBVar10->header).busyCount;
      *pfVar1 = *pfVar1 + -1;
      UNLOCK();
      __ptr = (SmallArray *)(pBVar10->header).nextArray;
      if ((BigArray *)__ptr == (BigArray *)0x0) {
        __ptr = (SmallArray *)calloc(1,0x810);
        if ((BigArray *)__ptr == (BigArray *)0x0) {
          piVar6 = __errno_location();
          *piVar6 = 0xc;
LAB_0043a638:
          iVar9 = -1;
          goto LAB_0043a63d;
        }
        LOCK();
        pBVar4 = (pBVar10->header).nextArray;
        bVar11 = pBVar4 == (BigArray *)0x0;
        if (bVar11) {
          (pBVar10->header).nextArray = (BigArray *)__ptr;
          pBVar4 = (BigArray *)0x0;
        }
        UNLOCK();
        if (!bVar11) {
          free(__ptr);
          __ptr = (SmallArray *)pBVar4;
        }
      }
      LOCK();
      pfVar1 = &(((BigArray *)__ptr)->header).busyCount;
      iVar2 = *pfVar1;
      *pfVar1 = *pfVar1 + 1;
      UNLOCK();
      pBVar10 = (BigArray *)__ptr;
      if (iVar2 < 0x100) {
        lVar8 = 0x10;
        do {
          piVar6 = (int *)((long)&(((BigArray *)(((BigArray *)__ptr)->entries + -2))->header).
                                  nextArray + lVar8);
          LOCK();
          bVar11 = *piVar6 == 0;
          if (bVar11) {
            *piVar6 = -1;
          }
          UNLOCK();
          if (bVar11) {
            piVar6 = (int *)((long)&(((BigArray *)(((BigArray *)__ptr)->entries + -2))->header).
                                    nextArray + lVar8);
            goto LAB_0043a48d;
          }
          lVar8 = lVar8 + 8;
        } while (lVar8 != 0x810);
      }
    } while( true );
  }
  lVar8 = 0;
  __ptr = &children;
LAB_0043a3e3:
  piVar6 = (int *)((long)&children.entries[0].pid + lVar8);
  LOCK();
  bVar11 = *piVar6 == 0;
  if (bVar11) {
    *piVar6 = -1;
  }
  UNLOCK();
  if (!bVar11) goto code_r0x0043a3f1;
  piVar6 = (int *)((long)&children.entries[0].pid + lVar8);
LAB_0043a48d:
  iVar2 = create_pipe((int *)&local_40,flags);
  if (iVar2 != -1) {
    iVar2 = eventfd(0,0x80000);
    if (iVar2 == -1) {
      iVar3 = pipe2((int *)&local_48,0x80000);
      if (iVar3 != -1) {
        iVar3 = fork();
        if (iVar3 != -1) goto LAB_0043a504;
        do {
          iVar2 = close((int)local_48);
          if (iVar2 != -1) break;
          piVar5 = __errno_location();
        } while (*piVar5 == 4);
        do {
          iVar2 = close(local_48._4_4_);
          if (iVar2 != -1) break;
          piVar5 = __errno_location();
        } while (*piVar5 == 4);
      }
    }
    else {
      iVar3 = fork();
      if (iVar3 != -1) {
LAB_0043a504:
        if (ppid != (pid_t *)0x0) {
          *ppid = iVar3;
        }
        if (iVar3 == 0) {
          if (iVar2 == -1) {
            local_50 = (undefined1 *)CONCAT71(local_50._1_7_,0xaa);
            do {
              iVar2 = close(local_48._4_4_);
              if (iVar2 != -1) break;
              piVar6 = __errno_location();
            } while (*piVar6 == 4);
            do {
              sVar7 = read((int)local_48,&local_50,1);
              if ((int)sVar7 != -1) break;
              piVar6 = __errno_location();
            } while (*piVar6 == 4);
            do {
              iVar2 = close((int)local_48);
              if (iVar2 != -1) break;
              piVar6 = __errno_location();
            } while (*piVar6 == 4);
          }
          else {
            local_50 = &DAT_aaaaaaaaaaaaaaaa;
            do {
              iVar3 = eventfd_read(iVar2,(eventfd_t *)&local_50);
              if (iVar3 != -1) break;
              piVar6 = __errno_location();
            } while (*piVar6 == 4);
            do {
              iVar3 = close(iVar2);
              if (iVar3 != -1) break;
              piVar6 = __errno_location();
            } while (*piVar6 == 4);
          }
          do {
            iVar2 = close((int)local_40);
            if (iVar2 != -1) break;
            piVar6 = __errno_location();
          } while (*piVar6 == 4);
          iVar9 = -2;
          do {
            iVar2 = close(local_40._4_4_);
            if (iVar2 != -1) break;
            piVar6 = __errno_location();
          } while (*piVar6 == 4);
        }
        else {
          piVar6[1] = local_40._4_4_;
          iVar9 = (int)local_40;
          *piVar6 = iVar3;
          if (iVar2 == -1) {
            do {
              iVar2 = close((int)local_48);
              if (iVar2 != -1) break;
              piVar6 = __errno_location();
            } while (*piVar6 == 4);
            do {
              sVar7 = write(local_48._4_4_,"",1);
              if ((int)sVar7 != -1) break;
              piVar6 = __errno_location();
            } while (*piVar6 == 4);
            do {
              iVar2 = close(local_48._4_4_);
              if (iVar2 != -1) break;
              piVar6 = __errno_location();
            } while (*piVar6 == 4);
          }
          else {
            do {
              iVar3 = eventfd_write(iVar2,0x2a);
              if (iVar3 != -1) break;
              piVar6 = __errno_location();
            } while (*piVar6 == 4);
            while (iVar3 = close(iVar2), iVar3 == -1) {
              piVar6 = __errno_location();
              if (*piVar6 != 4) break;
            }
          }
        }
LAB_0043a63d:
        if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
          __stack_chk_fail();
        }
        return iVar9;
      }
      do {
        iVar3 = close(iVar2);
        if (iVar3 != -1) break;
        piVar5 = __errno_location();
      } while (*piVar5 == 4);
    }
    do {
      iVar2 = close((int)local_40);
      if (iVar2 != -1) break;
      piVar5 = __errno_location();
    } while (*piVar5 == 4);
    do {
      iVar2 = close(local_40._4_4_);
      if (iVar2 != -1) break;
      piVar5 = __errno_location();
    } while (*piVar5 == 4);
  }
  piVar6[1] = -1;
  *piVar6 = 0;
  LOCK();
  pfVar1 = &(((BigArray *)__ptr)->header).busyCount;
  *pfVar1 = *pfVar1 + -1;
  UNLOCK();
  goto LAB_0043a638;
code_r0x0043a3f1:
  lVar8 = lVar8 + 8;
  if (lVar8 == 0x80) goto LAB_0043a3fe;
  goto LAB_0043a3e3;
}

Assistant:

static int forkfd_fork_fallback(int flags, pid_t *ppid)
{
    Header *header;
    ProcessInfo *info;
    pid_t pid;
    int fd = -1;
    int death_pipe[2];
    int sync_pipe[2];
    int ret;
    int efd = -1;

    (void) pthread_once(&forkfd_initialization, forkfd_initialize);

    info = allocateInfo(&header);
    if (info == NULL) {
        errno = ENOMEM;
        return -1;
    }

    /* create the pipes before we fork */
    if (create_pipe(death_pipe, flags) == -1)
        goto err_free; /* failed to create the pipes, pass errno */

#ifdef HAVE_EVENTFD
    /* try using an eventfd, which consumes less resources */
    efd = eventfd(0, EFD_CLOEXEC);
#endif
    if (efd == -1) {
        /* try a pipe */
        if (create_pipe(sync_pipe, FFD_CLOEXEC) == -1) {
            /* failed both at eventfd and pipe; fail and pass errno */
            goto err_close;
        }
    }

    /* now fork */
    pid = fork();
    if (pid == -1)
        goto err_close2; /* failed to fork, pass errno */
    if (ppid)
        *ppid = pid;

    /*
     * We need to store the child's PID in the info structure, so
     * the SIGCHLD handler knows that this child is present and it
     * knows the writing end of the pipe to pass information on.
     * However, the child process could exit before we stored the
     * information (or the handler could run for other children exiting).
     * We prevent that from happening by blocking the child process in
     * a read(2) until we're finished storing the information.
     */
    if (pid == 0) {
        /* this is the child process */
        /* first, wait for the all clear */
        if (efd != -1) {
#ifdef HAVE_EVENTFD
            eventfd_t val64;
            EINTR_LOOP(ret, eventfd_read(efd, &val64));
            EINTR_LOOP(ret, close(efd));
#endif
        } else {
            char c;
            EINTR_LOOP(ret, close(sync_pipe[1]));
            EINTR_LOOP(ret, read(sync_pipe[0], &c, sizeof c));
            EINTR_LOOP(ret, close(sync_pipe[0]));
        }

        /* now close the pipes and return to the caller */
        EINTR_LOOP(ret, close(death_pipe[0]));
        EINTR_LOOP(ret, close(death_pipe[1]));
        fd = FFD_CHILD_PROCESS;
    } else {
        /* parent process */
        info->deathPipe = death_pipe[1];
        fd = death_pipe[0];
        ffd_atomic_store(&info->pid, pid, FFD_ATOMIC_RELEASE);

        /* release the child */
#ifdef HAVE_EVENTFD
        if (efd != -1) {
            eventfd_t val64 = 42;
            EINTR_LOOP(ret, eventfd_write(efd, val64));
            EINTR_LOOP(ret, close(efd));
        } else
#endif
        {
            /*
             * Usually, closing would be enough to make read(2) return and the child process
             * continue. We need to write here: another thread could be calling forkfd at the
             * same time, which means auxpipe[1] might be open in another child process.
             */
            EINTR_LOOP(ret, close(sync_pipe[0]));
            EINTR_LOOP(ret, write(sync_pipe[1], "", 1));
            EINTR_LOOP(ret, close(sync_pipe[1]));
        }
    }

    return fd;

err_close2:
#ifdef HAVE_EVENTFD
    if (efd != -1) {
        EINTR_LOOP(ret, close(efd));
    } else
#endif
    {
        EINTR_LOOP(ret, close(sync_pipe[0]));
        EINTR_LOOP(ret, close(sync_pipe[1]));
    }
err_close:
    EINTR_LOOP(ret, close(death_pipe[0]));
    EINTR_LOOP(ret, close(death_pipe[1]));
err_free:
    /* free the info pointer */
    freeInfo(header, info);
    return -1;
}